

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXRefYs<signed_char>,_ImPlot::GetterXRefYs<signed_char>,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXRefYs<signed_char>,_ImPlot::GetterXRefYs<signed_char>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  char cVar7;
  int iVar8;
  ImU32 IVar9;
  uint uVar10;
  GetterXRefYs<signed_char> *pGVar11;
  TransformerLogLog *pTVar12;
  ImPlotPlot *pIVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  ImDrawIdx IVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  pIVar16 = GImPlot;
  pGVar11 = this->Getter1;
  pTVar12 = this->Transformer;
  iVar8 = pGVar11->Count;
  cVar7 = pGVar11->Ys
          [(long)(((pGVar11->Offset + prim) % iVar8 + iVar8) % iVar8) * (long)pGVar11->Stride];
  dVar23 = log10(pGVar11->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar16->LogDenX;
  pIVar13 = pIVar16->CurrentPlot;
  dVar3 = (pIVar13->XAxis).Range.Min;
  dVar4 = (pIVar13->XAxis).Range.Max;
  dVar24 = log10((double)(int)cVar7 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar16->CurrentPlot;
  dVar5 = pIVar13->YAxis[iVar8].Range.Min;
  fVar25 = (float)((((double)(float)(dVar23 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar13->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar8].Min.x);
  fVar20 = (float)((((double)(float)(dVar24 / pIVar16->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar16->My[iVar8] + (double)pIVar16->PixelRange[iVar8].Min.y);
  pGVar11 = this->Getter2;
  pTVar12 = this->Transformer;
  iVar8 = pGVar11->Count;
  cVar7 = pGVar11->Ys
          [(long)(((prim + pGVar11->Offset) % iVar8 + iVar8) % iVar8) * (long)pGVar11->Stride];
  dVar23 = log10(pGVar11->XRef / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar17->LogDenX;
  pIVar13 = pIVar17->CurrentPlot;
  dVar3 = (pIVar13->XAxis).Range.Min;
  dVar4 = (pIVar13->XAxis).Range.Max;
  dVar24 = log10((double)(int)cVar7 / pIVar13->YAxis[pTVar12->YAxis].Range.Min);
  iVar8 = pTVar12->YAxis;
  pIVar13 = pIVar17->CurrentPlot;
  dVar5 = pIVar13->YAxis[iVar8].Range.Min;
  fVar26 = (float)((((double)(float)(dVar23 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar13->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar8].Min.x);
  fVar27 = (float)((((double)(float)(dVar24 / pIVar17->LogDenY[iVar8]) *
                     (pIVar13->YAxis[iVar8].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar17->My[iVar8] + (double)pIVar17->PixelRange[iVar8].Min.y);
  fVar21 = fVar20;
  if (fVar27 <= fVar20) {
    fVar21 = fVar27;
  }
  bVar19 = false;
  if ((fVar21 < (cull_rect->Max).y) &&
     (fVar21 = (float)(~-(uint)(fVar27 <= fVar20) & (uint)fVar27 |
                      -(uint)(fVar27 <= fVar20) & (uint)fVar20), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar21 && fVar21 != *pfVar1)) {
    fVar21 = fVar25;
    if (fVar26 <= fVar25) {
      fVar21 = fVar26;
    }
    bVar19 = false;
    if (fVar21 < (cull_rect->Max).x) {
      fVar21 = (float)(~-(uint)(fVar26 <= fVar25) & (uint)fVar26 |
                      -(uint)(fVar26 <= fVar25) & (uint)fVar25);
      bVar19 = (cull_rect->Min).x <= fVar21 && fVar21 != (cull_rect->Min).x;
    }
  }
  if (bVar19 != false) {
    fVar21 = this->Weight;
    IVar9 = this->Col;
    IVar6 = *uv;
    fVar28 = fVar26 - fVar25;
    fVar29 = fVar27 - fVar20;
    fVar22 = fVar28 * fVar28 + fVar29 * fVar29;
    if (0.0 < fVar22) {
      if (fVar22 < 0.0) {
        fVar22 = sqrtf(fVar22);
      }
      else {
        fVar22 = SQRT(fVar22);
      }
      fVar28 = fVar28 * (1.0 / fVar22);
      fVar29 = fVar29 * (1.0 / fVar22);
    }
    fVar21 = fVar21 * 0.5;
    fVar28 = fVar28 * fVar21;
    fVar21 = fVar21 * fVar29;
    pIVar14 = DrawList->_VtxWritePtr;
    (pIVar14->pos).x = fVar21 + fVar25;
    (pIVar14->pos).y = fVar20 - fVar28;
    pIVar14->uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar9;
    pIVar14[1].pos.x = fVar21 + fVar26;
    pIVar14[1].pos.y = fVar27 - fVar28;
    pIVar14[1].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar9;
    pIVar14[2].pos.x = fVar26 - fVar21;
    pIVar14[2].pos.y = fVar28 + fVar27;
    pIVar14[2].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar9;
    pIVar14[3].pos.x = fVar25 - fVar21;
    pIVar14[3].pos.y = fVar28 + fVar20;
    pIVar14[3].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    uVar10 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar10;
    *pIVar15 = IVar18;
    pIVar15[1] = IVar18 + 1;
    pIVar15[2] = IVar18 + 2;
    pIVar15[3] = IVar18;
    pIVar15[4] = IVar18 + 2;
    pIVar15[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar10 + 4;
  }
  return bVar19;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }